

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O3

adios2_error
adios2_get_by_name(adios2_engine *engine,char *variable_name,void *data,adios2_mode mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  void *pvVar3;
  undefined4 uVar4;
  string dataStr;
  string local_c0;
  void *local_a0;
  allocator local_91;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"for adios2_engine, in call to adios2_get_by_name","");
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"for const char* variable_name, in call to adios2_get_by_name","");
  adios2::helper::CheckForNullptr<char_const>(variable_name,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get_by_name"
             ,"");
  anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  psVar2 = *(string **)(engine + 0x28);
  local_a0 = data;
  std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
  uVar4 = adios2::core::IO::InquireVariableType(psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  switch(uVar4) {
  case 1:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<signed_char>((string *)engine,(signed *)&local_c0,(Mode)local_a0);
    break;
  case 2:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<short>((string *)engine,(short *)&local_c0,(Mode)local_a0);
    break;
  case 3:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<int>((string *)engine,(int *)&local_c0,(Mode)local_a0);
    break;
  case 4:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<long>((string *)engine,(long *)&local_c0,(Mode)local_a0);
    break;
  case 5:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<unsigned_char>((string *)engine,(uchar *)&local_c0,(Mode)local_a0);
    break;
  case 6:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<unsigned_short>((string *)engine,(ushort *)&local_c0,(Mode)local_a0);
    break;
  case 7:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<unsigned_int>((string *)engine,(uint *)&local_c0,(Mode)local_a0);
    break;
  case 8:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<unsigned_long>((string *)engine,(ulong *)&local_c0,(Mode)local_a0);
    break;
  case 9:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<float>((string *)engine,(float *)&local_c0,(Mode)local_a0);
    break;
  case 10:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<double>((string *)engine,(double *)&local_c0,(Mode)local_a0);
    break;
  case 0xb:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<long_double>((string *)engine,(longdouble *)&local_c0,(Mode)local_a0);
    break;
  case 0xc:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<std::complex<float>>
              ((string *)engine,(complex *)&local_c0,(Mode)local_a0);
    break;
  case 0xd:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<std::complex<double>>
              ((string *)engine,(complex *)&local_c0,(Mode)local_a0);
    break;
  case 0xe:
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::string((string *)local_90,variable_name,&local_91);
    pvVar3 = local_a0;
    adios2::core::Engine::Get<std::__cxx11::string>
              ((string *)engine,(string *)local_90,(Mode)&local_c0);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    std::__cxx11::string::copy((char *)&local_c0,(ulong)pvVar3,local_c0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == paVar1) {
      return adios2_error_none;
    }
    operator_delete(local_c0._M_dataplus._M_p);
    return adios2_error_none;
  case 0xf:
    std::__cxx11::string::string((string *)&local_c0,variable_name,(allocator *)local_90);
    adios2::core::Engine::Get<char>((string *)engine,(char *)&local_c0,(Mode)local_a0);
    break;
  default:
    goto switchD_0011fd5c_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
switchD_0011fd5c_default:
  return adios2_error_none;
}

Assistant:

adios2_error adios2_get_by_name(adios2_engine *engine, const char *variable_name, void *data,
                                const adios2_mode mode)
{
    try
    {
        adios2::helper::CheckForNullptr(engine, "for adios2_engine, in call to adios2_get_by_name");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable_name, "for const char* variable_name, in call to "
                                                       "adios2_get_by_name");

        const adios2::Mode modeCpp =
            adios2_ToMode(mode, "only adios2_mode_deferred or adios2_mode_sync are valid, "
                                "in call to adios2_get_by_name");
        const adios2::DataType type(engineCpp->m_IO.InquireVariableType(variable_name));

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            std::string dataStr;
            engineCpp->Get(variable_name, dataStr);
            dataStr.copy(reinterpret_cast<char *>(data), dataStr.size());
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        engineCpp->Get(variable_name, reinterpret_cast<T *>(data), modeCpp);                       \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get_by_name"));
    }
}